

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

int fmt::fprintf(FILE *__stream,char *__format,...)

{
  size_t __size;
  size_t sVar1;
  anon_union_8_2_de49483c_for_ArgList_1 in_RCX;
  uint64_t in_RDX;
  MemoryWriter w;
  PrintfFormatter<char> local_268;
  BasicWriter<char> local_250;
  Buffer<char> local_240;
  char local_220 [504];
  
  local_250.buffer_ = &local_240;
  local_250._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0014c588;
  local_240.size_ = 0;
  local_240.capacity_ = 500;
  local_240._vptr_Buffer = (_func_int **)&PTR_grow_0014c5d0;
  local_268.super_FormatterBase.next_arg_index_ = 0;
  local_268.super_FormatterBase.args_.types_ = in_RDX;
  local_268.super_FormatterBase.args_.field_1 = in_RCX;
  local_240.ptr_ = local_220;
  internal::PrintfFormatter<char>::format(&local_268,&local_250,(BasicCStringRef<char>)__format);
  __size = (local_250.buffer_)->size_;
  sVar1 = fwrite((local_250.buffer_)->ptr_,__size,1,__stream);
  local_250._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0014c588;
  local_240._vptr_Buffer = (_func_int **)&PTR_grow_0014c5d0;
  if (local_240.ptr_ != local_220) {
    operator_delete(local_240.ptr_,local_240.capacity_);
  }
  return -(uint)(sVar1 == 0) | (uint)__size;
}

Assistant:

FMT_FUNC int fmt::fprintf(std::FILE *f, CStringRef format, ArgList args) {
  MemoryWriter w;
  printf(w, format, args);
  std::size_t size = w.size();
  return !std::fwrite(w.data(), size, 1, f) ? -1 : static_cast<int>(size);
}